

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmUnpkDn<(moira::Instr)175,(moira::Mode)4,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  Syntax SVar2;
  char cVar3;
  uint uVar4;
  long lVar5;
  char *pcVar6;
  Ea<(moira::Mode)4,_2> ry;
  Ea<(moira::Mode)4,_2> rx;
  u32 local_48;
  ushort local_44;
  u32 local_34;
  ushort local_30;
  
  *addr = *addr + 2;
  uVar4 = (*this->_vptr_Moira[6])();
  local_30 = op & 7;
  local_48 = *addr;
  local_44 = op >> 9 & 7;
  local_34 = local_48;
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    cVar3 = 'u';
    lVar5 = 0;
    do {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = cVar3;
      cVar3 = "unpk"[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = ' ';
    }
    else {
      iVar1 = (str->tab).raw;
      pcVar6 = str->ptr;
      do {
        str->ptr = pcVar6 + 1;
        *pcVar6 = ' ';
        pcVar6 = str->ptr;
      } while (pcVar6 < str->base + iVar1);
    }
    StrWriter::operator<<(str,(Ea<(moira::Mode)4,_2> *)&local_34);
    pcVar6 = str->ptr;
    str->ptr = pcVar6 + 1;
    *pcVar6 = ',';
    SVar2 = str->style->syntax;
    if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = ' ';
    }
    StrWriter::operator<<(str,(Ea<(moira::Mode)4,_2> *)&local_48);
    pcVar6 = str->ptr;
    str->ptr = pcVar6 + 1;
    *pcVar6 = ',';
    SVar2 = str->style->syntax;
    if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = ' ';
    }
    pcVar6 = str->ptr;
    str->ptr = pcVar6 + 1;
    *pcVar6 = '#';
    StrWriter::operator<<(str,(Int)(int)(short)uVar4);
  }
  else {
    cVar3 = 'u';
    lVar5 = 0;
    do {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = cVar3;
      cVar3 = "unpk"[lVar5 + 1];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = ' ';
    }
    else {
      iVar1 = (str->tab).raw;
      pcVar6 = str->ptr;
      do {
        str->ptr = pcVar6 + 1;
        *pcVar6 = ' ';
        pcVar6 = str->ptr;
      } while (pcVar6 < str->base + iVar1);
    }
    StrWriter::operator<<(str,(Ea<(moira::Mode)4,_2> *)&local_34);
    pcVar6 = str->ptr;
    str->ptr = pcVar6 + 1;
    *pcVar6 = ',';
    SVar2 = str->style->syntax;
    if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = ' ';
    }
    StrWriter::operator<<(str,(Ea<(moira::Mode)4,_2> *)&local_48);
    pcVar6 = str->ptr;
    str->ptr = pcVar6 + 1;
    *pcVar6 = ',';
    SVar2 = str->style->syntax;
    if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = ' ';
    }
    pcVar6 = str->ptr;
    str->ptr = pcVar6 + 1;
    *pcVar6 = '#';
    StrWriter::operator<<(str,(UInt)(uVar4 & 0xffff));
    if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
      cVar3 = ';';
      lVar5 = 1;
      do {
        pcVar6 = str->ptr;
        str->ptr = pcVar6 + 1;
        *pcVar6 = cVar3;
        cVar3 = "trap%-2s  ; (2+)"[lVar5 + 10];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 7);
    }
  }
  return;
}

Assistant:

void
Moira::dasmUnpkDn(StrWriter &str, u32 &addr, u16 op) const
{
    auto ext = dasmIncRead <Word> (addr);
    auto rx = Op <M,S> ( _____________xxx(op), addr );
    auto ry = Op <M,S> ( ____xxx_________(op), addr );

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            str << Ins<I>{} << str.tab << rx << Sep{} << ry << Sep{} << Ims<S>(ext);
            break;

        default:

            str << Ins<I>{} << str.tab << rx << Sep{} << ry << Sep{} << Imu(ext);
            str << Av<I, M, S>{};
    }
}